

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_utils.h
# Opt level: O2

void __thiscall
ktx::OptionsDeflate::process
          (OptionsDeflate *this,Options *param_1,ParseResult *args,Reporter *report)

{
  size_t sVar1;
  uint uVar2;
  OptionValue *pOVar3;
  uint *puVar4;
  allocator<char> local_49;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,kZStd,&local_49);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_48);
  sVar1 = pOVar3->m_count;
  std::__cxx11::string::~string((string *)&local_48);
  if (sVar1 != 0) {
    uVar2 = captureCompressOption<unsigned_int>(this,args,kZStd);
    (this->zstd).super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> =
         (_Optional_payload_base<unsigned_int>)((ulong)uVar2 | 0x100000000);
    if (uVar2 - 0x17 < 0xffffffea) {
      puVar4 = std::optional<unsigned_int>::value(&this->zstd);
      Reporter::fatal_usage<char_const(&)[68],unsigned_int&>
                (report,(char (*) [68])
                        "Invalid zstd level: \"{}\". Value must be between 1 and 22 inclusive.",
                 puVar4);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,kZLib,&local_49);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_48);
  sVar1 = pOVar3->m_count;
  std::__cxx11::string::~string((string *)&local_48);
  if (sVar1 != 0) {
    uVar2 = captureCompressOption<unsigned_int>(this,args,kZLib);
    (this->zlib).super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> =
         (_Optional_payload_base<unsigned_int>)((ulong)uVar2 | 0x100000000);
    if (uVar2 - 10 < 0xfffffff7) {
      puVar4 = std::optional<unsigned_int>::value(&this->zlib);
      Reporter::fatal_usage<char_const(&)[67],unsigned_int&>
                (report,(char (*) [67])
                        "Invalid zlib level: \"{}\". Value must be between 1 and 9 inclusive.",
                 puVar4);
    }
  }
  if (((this->zstd).super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>._M_engaged == true) &&
     ((this->zlib).super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged == true)) {
    Reporter::fatal_usage<char_const(&)[68]>
              (report,(char (*) [68])
                      "Conflicting options: zstd and zlib cannot be used at the same time.");
  }
  return;
}

Assistant:

void process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter& report) {
        if (args[kZStd].count()) {
            zstd = captureCompressOption<uint32_t>(args, kZStd);
            if (zstd < 1u || zstd > 22u)
                report.fatal_usage("Invalid zstd level: \"{}\". Value must be between 1 and 22 inclusive.", zstd.value());
        }
        if (args[kZLib].count()) {
            zlib = captureCompressOption<uint32_t>(args, kZLib);
            if (zlib < 1u || zlib > 9u)
                report.fatal_usage("Invalid zlib level: \"{}\". Value must be between 1 and 9 inclusive.", zlib.value());
        }
        if (zstd.has_value() && zlib.has_value())
            report.fatal_usage("Conflicting options: zstd and zlib cannot be used at the same time.");
    }